

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeparationPart.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::SeparationPart::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,SeparationPart *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KStringStream ss;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Separation Part:");
  poVar1 = std::operator<<(poVar1,"\n Reason for Separation: ");
  ENUMS::GetEnumAsStringReasonForSeparation_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)this->m_ui8Reason,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\n\tPre-Entity Indicator:  ");
  ENUMS::GetEnumAsStringPreEntityIndicator_abi_cxx11_
            (&local_1e0,(ENUMS *)(ulong)this->m_ui8PreEntIndicator,Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"\n\tParent Entity Id:      ");
  EntityIdentifier::GetAsString_abi_cxx11_(&local_200,&this->m_ParentEntId);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  poVar1 = std::operator<<(poVar1,"\n\tStation Location:      ");
  NamedLocationIdentifier::GetAsString_abi_cxx11_(&local_220,&this->m_StationLoc);
  std::operator<<(poVar1,(string *)&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString SeparationPart::GetAsString() const
{
    KStringStream ss;

    ss << "Separation Part:"
       << "\n Reason for Separation: " << GetEnumAsStringReasonForSeparation(m_ui8Reason)
       << "\n\tPre-Entity Indicator:  " << GetEnumAsStringPreEntityIndicator( m_ui8PreEntIndicator )
       << "\n\tParent Entity Id:      " << m_ParentEntId.GetAsString()
       << "\n\tStation Location:      " << m_StationLoc.GetAsString();

    return ss.str();
}